

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction
          (ConversionStream *this,Char *FuncName,bool *bTakesInputPatch)

{
  anon_class_16_2_002f3f82 ArgHandler;
  anon_class_16_2_199f7167 ArgHandler_00;
  bool bVar1;
  ostream *poVar2;
  pointer pHVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  HLSLTokenInfo local_778;
  const_iterator local_728;
  String local_720;
  undefined1 local_700 [8];
  string err_4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_6d8;
  iterator FirstStatementToken;
  undefined1 local_6b0 [8];
  string err_3;
  undefined1 local_670 [8];
  string err_2;
  string local_648 [8];
  String Prologue;
  allocator local_619;
  string local_618;
  allocator local_5f1;
  string local_5f0 [32];
  string local_5d0;
  HLSLTokenInfo local_5b0;
  const_iterator local_560;
  ConversionStream *local_558;
  stringstream *psStack_550;
  ConversionStream *local_548;
  stringstream *psStack_540;
  _List_node_base *local_538;
  allocator local_529;
  string local_528;
  allocator local_501;
  string local_500;
  HLSLTokenInfo local_4e0;
  const_iterator local_490;
  string local_488 [8];
  String Argument;
  ShaderParameterInfo *TopLevelParam;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *__range1;
  Char *ReturnMacroName;
  stringstream ReturnHandlerSS;
  ostream local_430 [376];
  stringstream local_2b8 [8];
  stringstream PrologueSS;
  bool local_129;
  iterator iStack_128;
  bool bIsVoid;
  iterator ArgsListEndToken;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  Params;
  undefined1 local_e8 [8];
  string err_1;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_c0;
  iterator TypeToken;
  char *EntryPoint;
  String local_a0;
  undefined1 local_79;
  undefined1 local_78 [8];
  string err;
  anon_class_24_3_e6290b07 local_50;
  _List_node_base *local_38;
  iterator local_30;
  iterator Token;
  iterator EntryPointToken;
  bool *bTakesInputPatch_local;
  Char *FuncName_local;
  ConversionStream *this_local;
  
  bTakesInputPatch_local = (bool *)FuncName;
  FuncName_local = (Char *)this;
  Token = std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::end(&this->m_Tokens);
  local_30 = std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::begin(&this->m_Tokens);
  local_38 = (_List_node_base *)
             std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::end(&this->m_Tokens);
  local_50.FuncName = &bTakesInputPatch_local;
  local_50.EntryPointToken = &Token;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x134;
  local_50.this = this;
  ProcessScope<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(char_const*,bool&)::__0>
            (this,&local_30,(iterator)local_38,OpenBrace,ClosingBrace,&local_50);
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(&Token,(_Self *)((long)&err.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_79 = 0x22;
    FormatString<char[47],char_const*,char>
              ((string *)local_78,(Diligent *)"Unable to find hull shader constant function \"",
               (char (*) [47])&bTakesInputPatch_local,(char **)&local_79,(char *)pbVar5);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_a0,this,&Token,4);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd3a,pbVar5,(char (*) [2])0xc39489,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)local_78);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&Token);
  TypeToken._M_node = (_List_node_base *)std::__cxx11::string::c_str();
  local_c0._M_node = Token._M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_c0);
  err_1.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       begin(&this->m_Tokens);
  bVar1 = std::operator!=(&local_c0,(_Self *)((long)&err_1.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&Token);
    FormatString<char[11],std::__cxx11::string,char[21]>
              ((string *)local_e8,(Diligent *)"Function \"",(char (*) [11])&pHVar3->Literal,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" misses return type",(char (*) [21])pbVar5);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)
               &Params.
                super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,&local_c0,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd42,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
               (char (*) [2])0xc39489,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &Params.
                super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &Params.
                super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_e8);
  }
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::vector((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            *)&ArgsListEndToken);
  iStack_128._M_node = local_c0._M_node;
  local_129 = false;
  ProcessFunctionParameters
            (this,&stack0xfffffffffffffed8,
             (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              *)&ArgsListEndToken,&local_129);
  std::__cxx11::stringstream::stringstream(local_2b8);
  std::__cxx11::stringstream::stringstream((stringstream *)&ReturnMacroName);
  poVar2 = std::operator<<(local_430,"#define ");
  poVar2 = std::operator<<(poVar2,"_CONST_FUNC_RETURN_");
  pcVar4 = "(_RET_VAL_)";
  if ((local_129 & 1U) != 0) {
    pcVar4 = "";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2," {\\\n");
  *bTakesInputPatch = false;
  __end1 = std::
           vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ::begin((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    *)&ArgsListEndToken);
  TopLevelParam =
       (ShaderParameterInfo *)
       std::
       vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
       ::end((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              *)&ArgsListEndToken);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                                     *)&TopLevelParam), bVar1) {
    Argument.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
         ::operator*(&__end1);
    if (((reference)Argument.field_2._8_8_)->storageQualifier == In) {
      if ((((reference)Argument.field_2._8_8_)->HSAttribs).PatchType == InputPatch) {
        *bTakesInputPatch = true;
        std::__cxx11::string::string(local_488,(string *)&((reference)Argument.field_2._8_8_)->Type)
        ;
        std::__cxx11::string::push_back((char)local_488);
        std::__cxx11::string::append(local_488);
        std::__cxx11::string::push_back((char)local_488);
        std::__cxx11::string::append(local_488);
        std::__cxx11::string::push_back((char)local_488);
        std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                  (&local_490,&stack0xfffffffffffffed8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_500,pcVar4,&local_501);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_528,"",&local_529);
        Parsing::HLSLTokenInfo::HLSLTokenInfo
                  (&local_4e0,TextBlock,&local_500,&local_528,0xffffffffffffffff);
        local_538 = (_List_node_base *)
                    std::__cxx11::
                    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                    ::insert(&this->m_Tokens,local_490,&local_4e0);
        Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_4e0);
        std::__cxx11::string::~string((string *)&local_528);
        std::allocator<char>::~allocator((allocator<char> *)&local_529);
        std::__cxx11::string::~string((string *)&local_500);
        std::allocator<char>::~allocator((allocator<char> *)&local_501);
        std::__cxx11::string::~string(local_488);
      }
      else {
        psStack_540 = (stringstream *)local_2b8;
        ArgHandler.PrologueSS = psStack_540;
        ArgHandler.this = this;
        local_548 = this;
        ProcessShaderArgument<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(char_const*,bool&)::__1>
                  (this,(ShaderParameterInfo *)Argument.field_2._8_8_,3,0,psStack_540,ArgHandler);
      }
    }
    else if ((((reference)Argument.field_2._8_8_)->storageQualifier == Out) ||
            (((reference)Argument.field_2._8_8_)->storageQualifier == Ret)) {
      psStack_550 = (stringstream *)&ReturnMacroName;
      ArgHandler_00.ReturnHandlerSS = psStack_550;
      ArgHandler_00.this = this;
      local_558 = this;
      ProcessShaderArgument<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(char_const*,bool&)::__2>
                (this,(ShaderParameterInfo *)Argument.field_2._8_8_,3,1,(stringstream *)local_2b8,
                 ArgHandler_00);
    }
    __gnu_cxx::
    __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
    ::operator++(&__end1);
  }
  std::operator<<(local_430,"return;}\n");
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_560,&local_c0);
  std::__cxx11::stringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d0,pcVar4,&local_5f1);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_c0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_618,pcVar4,&local_619);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_5b0,TextBlock,&local_5d0,&local_618,0xffffffffffffffff);
  Prologue.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       insert(&this->m_Tokens,local_560,&local_5b0);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_5b0);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::__cxx11::string::~string(local_5f0);
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_c0);
  std::__cxx11::string::operator=((string *)&pHVar3->Delimiter,"\n");
  std::__cxx11::stringstream::str();
  local_30._M_node = iStack_128._M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_30);
  err_2.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(&local_30,(_Self *)((long)&err_2.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[55],char_const*,char[3]>
              ((string *)local_670,
               (Diligent *)"Unexpected end of file while looking for the body of \"",
               (char (*) [55])&TypeToken,(char **)0xc4a556,(char (*) [3])pbVar5);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&err_3.field_2 + 8),this,&local_30,4);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd93,pbVar5,(char (*) [2])0xc39489,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_3.field_2 + 8));
    std::__cxx11::string::~string((string *)(err_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_670);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_30);
  if (pHVar3->Type != OpenBrace) {
    FormatString<char[13]>((string *)local_6b0,(char (*) [13])"\'{\' expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&FirstStatementToken,this,&local_30,4);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd94,pbVar5,(char (*) [2])0xc39489,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &FirstStatementToken);
    std::__cxx11::string::~string((string *)&FirstStatementToken);
    std::__cxx11::string::~string((string *)local_6b0);
  }
  local_6d8._M_node = local_30._M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_6d8);
  err_4.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(&local_6d8,(_Self *)((long)&err_4.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[55],char_const*,char[3]>
              ((string *)local_700,
               (Diligent *)"Unexpected end of file while looking for the body of \"",
               (char (*) [55])&TypeToken,(char **)0xc4a556,(char (*) [3])pbVar5);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_720,this,&local_6d8,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd9c,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700
               ,(char (*) [2])0xc39489,&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)local_700);
  }
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_728,&local_6d8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_798,pcVar4,&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c0,"\n",&local_7c1);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_778,TextBlock,&local_798,&local_7c0,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::insert
            (&this->m_Tokens,local_728,&local_778);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_778);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  ProcessReturnStatements
            (this,&local_30,(bool)(local_129 & 1),(Char *)TypeToken._M_node,"_CONST_FUNC_RETURN_");
  std::__cxx11::string::~string(local_648);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ReturnMacroName);
  std::__cxx11::stringstream::~stringstream(local_2b8);
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::~vector((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             *)&ArgsListEndToken);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(const Char* FuncName, bool& bTakesInputPatch)
{
    // Search for the function in the global scope
    auto EntryPointToken = m_Tokens.end();
    auto Token           = m_Tokens.begin();
    ProcessScope(
        Token, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& tkn, int ScopeDepth) //
        {
            if (ScopeDepth == 0 && tkn->Type == TokenType::Identifier && tkn->Literal == FuncName)
            {
                EntryPointToken = tkn;
                tkn             = m_Tokens.end();
            }
            else
                ++tkn;
        } //
    );
    VERIFY_PARSER_STATE(EntryPointToken, EntryPointToken != m_Tokens.end(), "Unable to find hull shader constant function \"", FuncName, '\"');
    const auto* EntryPoint = EntryPointToken->Literal.c_str();

    auto TypeToken = EntryPointToken;
    --TypeToken;
    // void ConstantHS( InputPatch<VSOutput, 1> p,
    // ^
    // TypeToken
    VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.begin(), "Function \"", EntryPointToken->Literal, "\" misses return type");

    std::vector<ShaderParameterInfo> Params;

    auto ArgsListEndToken = TypeToken;
    bool bIsVoid          = false;
    ProcessFunctionParameters(ArgsListEndToken, Params, bIsVoid);
    // HS_CONSTANT_DATA_OUTPUT ConstantHS( InputPatch<VSOutput, 1> p,
    //                                     uint BlockID : SV_PrimitiveID)
    //                                                                  ^
    //                                                       ArgsListEndToken

    std::stringstream PrologueSS, ReturnHandlerSS;
    const Char*       ReturnMacroName = "_CONST_FUNC_RETURN_";
    // Some GLES compilers cannot properly handle macros with empty argument lists, such as _CONST_FUNC_RETURN_().
    // Also, some compilers generate an error if there is no whitespace after the macro without arguments: _CONST_FUNC_RETURN_{
    ReturnHandlerSS << "#define " << ReturnMacroName << (bIsVoid ? "" : "(_RET_VAL_)") << " {\\\n";

    bTakesInputPatch = false;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            if (TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::InputPatch)
            {
                bTakesInputPatch = true;
                String Argument(TopLevelParam.Type);
                Argument.push_back(' ');
                Argument.append(TopLevelParam.Name);
                Argument.push_back('[');
                Argument.append(TopLevelParam.ArraySize);
                Argument.push_back(']');
                m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, Argument.c_str()));
            }
            else
            {
                ProcessShaderArgument(
                    TopLevelParam, HSInd, InVar, PrologueSS,
                    [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                    {
                        String FullIndexedParamName = BuildParameterName(MemberStack, '.');
                        if (Getter.empty())
                        {
                            LOG_ERROR_AND_THROW("Supported inputs to a hull shader constant function are \"InputPatch<>\" and variables with SV_ semantic.\n"
                                                "Variable \"",
                                                Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                        }
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                    } //
                );
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, HSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (Setter.empty())
                    {
                        LOG_ERROR_AND_THROW("Supported output semantics of a hull shader constant function are \"SV_TessFactor\" and \"SV_InsideTessFactor\".\n"
                                            "Variable \"",
                                            Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                    }

                    // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                    // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                    ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                } //
            );
        }
    }
    ReturnHandlerSS << "return;}\n";
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, ReturnHandlerSS.str().c_str(), TypeToken->Delimiter.c_str()));
    TypeToken->Delimiter = "\n";

    String Prologue = PrologueSS.str();
    Token           = ArgsListEndToken;
    ++Token;
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenBrace, "\'{\' expected");

    auto FirstStatementToken = Token;
    ++FirstStatementToken;
    // void main ()
    // {
    //      int a;
    //      ^
    VERIFY_PARSER_STATE(FirstStatementToken, FirstStatementToken != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");

    // Insert prologue before the first token
    m_Tokens.insert(FirstStatementToken, TokenInfo(TokenType::TextBlock, Prologue.c_str(), "\n"));

    ProcessReturnStatements(Token, bIsVoid, EntryPoint, ReturnMacroName);
}